

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall testing::Sequence::AddExpectation(Sequence *this,Expectation *expectation)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<testing::internal::ExpectationBase> *__a;
  __shared_ptr_access<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar3;
  Expectation *expectation_local;
  Sequence *this_local;
  
  peVar2 = std::__shared_ptr_access<testing::Expectation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<testing::Expectation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  bVar1 = Expectation::operator!=(peVar2,expectation);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<testing::Expectation,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<testing::Expectation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    __a = Expectation::expectation_base(peVar2);
    bVar1 = std::operator!=(__a,(nullptr_t)0x0);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<testing::Expectation,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<testing::Expectation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
      this_00 = (__shared_ptr_access<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)Expectation::expectation_base(expectation);
      peVar3 = std::
               __shared_ptr_access<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      ExpectationSet::operator+=(&peVar3->immediate_prerequisites_,peVar2);
    }
    peVar2 = std::
             __shared_ptr_access<testing::Expectation,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<testing::Expectation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
    Expectation::operator=(peVar2,expectation);
  }
  return;
}

Assistant:

void Sequence::AddExpectation(const Expectation& expectation) const {
  if (*last_expectation_ != expectation) {
    if (last_expectation_->expectation_base() != nullptr) {
      expectation.expectation_base()->immediate_prerequisites_
          += *last_expectation_;
    }
    *last_expectation_ = expectation;
  }
}